

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O1

void __thiscall
(anonymous_namespace)::InfoWriter::
SetConfigArray<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (InfoWriter *this,string *key,
          ConfigStrings<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *cfgStr)

{
  Value *pVVar1;
  _Hash_node_base *p_Var2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string local_b0;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  undefined8 local_80;
  undefined1 *local_78;
  _Hash_node_base *local_70;
  _Hash_node_base *local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  pVVar1 = Json::Value::operator[]((Value *)this,key);
  MakeStringArray<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (pVVar1,&cfgStr->Default);
  p_Var2 = (cfgStr->Config)._M_h._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    do {
      local_90._M_str = (key->_M_dataplus)._M_p;
      local_90._M_len = key->_M_string_length;
      local_60 = 1;
      local_50[0] = 0x5f;
      local_80 = 1;
      local_68 = p_Var2[1]._M_nxt;
      local_70 = p_Var2[2]._M_nxt;
      views._M_len = 3;
      views._M_array = &local_90;
      local_78 = local_50;
      local_58 = local_50;
      cmCatViews_abi_cxx11_(&local_b0,views);
      pVVar1 = Json::Value::operator[]((Value *)this,&local_b0);
      MakeStringArray<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (pVVar1,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(p_Var2 + 5));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void InfoWriter::SetConfigArray(
  std::string const& key,
  cmQtAutoGenInitializer::ConfigStrings<CONT> const& cfgStr)
{
  this->SetArray(key, cfgStr.Default);
  for (auto const& item : cfgStr.Config) {
    this->SetArray(cmStrCat(key, '_', item.first), item.second);
  }
}